

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_decode_extl(char **data,int8_t *type)

{
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  uint local_20;
  uint32_t len;
  uint8_t c;
  int8_t *type_local;
  char **data_local;
  
  uVar1 = mp_load_u8(data);
  switch(uVar1) {
  case 199:
    bVar2 = mp_load_u8(data);
    local_20 = (uint)bVar2;
    break;
  case 200:
    uVar3 = mp_load_u16(data);
    local_20 = (uint)uVar3;
    break;
  case 0xc9:
    local_20 = mp_load_u32(data);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
    local_20 = 1 << (uVar1 + 0x2c & 0x1f);
  }
  uVar1 = mp_load_u8(data);
  *type = uVar1;
  return local_20;
}

Assistant:

MP_IMPL uint32_t
mp_decode_extl(const char **data, int8_t *type) {
	uint8_t c = mp_load_u8(data);
	uint32_t len;
	switch 	 (c) {
	case 0xd4:
	case 0xd5:
	case 0xd6:
	case 0xd7:
	case 0xd8:
		len = 1u << (c - 0xd4);
		break;
	case 0xc7:
		len = mp_load_u8(data);
		break;
	case 0xc8:
		len = mp_load_u16(data);
		break;
	case 0xc9:
		len = mp_load_u32(data);
		break;
	default:
		mp_unreachable();
	}
	*type = mp_load_u8(data);
	return len;
}